

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

Curl_tree * Curl_splayinsert(curltime i,Curl_tree *t,Curl_tree *node)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [12];
  timediff_t tVar6;
  curltime i_00;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  Curl_tree *node_local;
  Curl_tree *t_local;
  curltime i_local;
  
  auVar5 = i._0_12_;
  node_local = t;
  if (t != (Curl_tree *)0x0) {
    i_00._12_4_ = 0;
    i_00.tv_sec = auVar5._0_8_;
    i_00.tv_usec = auVar5._8_4_;
    node_local = Curl_splay(i_00,t);
    uVar1 = (node_local->key).tv_sec;
    uVar2 = (node_local->key).tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    newer._12_4_ = 0;
    newer.tv_sec = auVar5._0_8_;
    newer.tv_usec = auVar5._8_4_;
    older._12_4_ = 0;
    tVar6 = Curl_timediff_us(newer,older);
    if (tVar6 == 0) {
      (node->key).tv_sec = -1;
      (node->key).tv_usec = -1;
      *(undefined4 *)&(node->key).field_0xc = 0;
      node->samen = node_local;
      node->samep = node_local->samep;
      node_local->samep->samen = node;
      node_local->samep = node;
      return node_local;
    }
  }
  if (node_local == (Curl_tree *)0x0) {
    node->larger = (Curl_tree *)0x0;
    node->smaller = (Curl_tree *)0x0;
  }
  else {
    uVar3 = (node_local->key).tv_sec;
    uVar4 = (node_local->key).tv_usec;
    older_00.tv_usec = uVar4;
    older_00.tv_sec = uVar3;
    newer_00._12_4_ = 0;
    newer_00.tv_sec = auVar5._0_8_;
    newer_00.tv_usec = auVar5._8_4_;
    older_00._12_4_ = 0;
    tVar6 = Curl_timediff_us(newer_00,older_00);
    if (tVar6 < 0) {
      node->smaller = node_local->smaller;
      node->larger = node_local;
      node_local->smaller = (Curl_tree *)0x0;
    }
    else {
      node->larger = node_local->larger;
      node->smaller = node_local;
      node_local->larger = (Curl_tree *)0x0;
    }
  }
  (node->key).tv_sec = i.tv_sec;
  *(ulong *)&(node->key).tv_usec = CONCAT44(i_local.tv_sec._4_4_,i.tv_usec);
  node->samen = node;
  node->samep = node;
  return node;
}

Assistant:

struct Curl_tree *Curl_splayinsert(struct curltime i,
                                   struct Curl_tree *t,
                                   struct Curl_tree *node)
{
  static const struct curltime KEY_NOTUSED = {
    ~0, -1
  }; /* will *NEVER* appear */

  DEBUGASSERT(node);

  if(t) {
    t = Curl_splay(i, t);
    DEBUGASSERT(t);
    if(compare(i, t->key) == 0) {
      /* There already exists a node in the tree with the very same key. Build
         a doubly-linked circular list of nodes. We add the new 'node' struct
         to the end of this list. */

      node->key = KEY_NOTUSED; /* we set the key in the sub node to NOTUSED
                                  to quickly identify this node as a subnode */
      node->samen = t;
      node->samep = t->samep;
      t->samep->samen = node;
      t->samep = node;

      return t; /* the root node always stays the same */
    }
  }

  if(!t) {
    node->smaller = node->larger = NULL;
  }
  else if(compare(i, t->key) < 0) {
    node->smaller = t->smaller;
    node->larger = t;
    t->smaller = NULL;

  }
  else {
    node->larger = t->larger;
    node->smaller = t;
    t->larger = NULL;
  }
  node->key = i;

  /* no identical nodes (yet), we are the only one in the list of nodes */
  node->samen = node;
  node->samep = node;
  return node;
}